

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_stage11_sse2(__m128i *output,__m128i *x)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  
  alVar2 = *x;
  alVar1 = x[0x3f];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  *output = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x3f] = alVar2;
  alVar2 = x[1];
  alVar1 = x[0x3e];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[1] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x3e] = alVar2;
  alVar2 = x[2];
  alVar1 = x[0x3d];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[2] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x3d] = alVar2;
  alVar2 = x[3];
  alVar1 = x[0x3c];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[3] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x3c] = alVar2;
  alVar2 = x[4];
  alVar1 = x[0x3b];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[4] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x3b] = alVar2;
  alVar2 = x[5];
  alVar1 = x[0x3a];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[5] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x3a] = alVar2;
  alVar2 = x[6];
  alVar1 = x[0x39];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[6] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x39] = alVar2;
  alVar2 = x[7];
  alVar1 = x[0x38];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[7] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x38] = alVar2;
  alVar2 = x[8];
  alVar1 = x[0x37];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[8] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x37] = alVar2;
  alVar2 = x[9];
  alVar1 = x[0x36];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[9] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x36] = alVar2;
  alVar2 = x[10];
  alVar1 = x[0x35];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[10] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x35] = alVar2;
  alVar2 = x[0xb];
  alVar1 = x[0x34];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xb] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x34] = alVar2;
  alVar2 = x[0xc];
  alVar1 = x[0x33];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xc] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x33] = alVar2;
  alVar2 = x[0xd];
  alVar1 = x[0x32];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xd] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x32] = alVar2;
  alVar2 = x[0xe];
  alVar1 = x[0x31];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xe] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x31] = alVar2;
  alVar2 = x[0xf];
  alVar1 = x[0x30];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0xf] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x30] = alVar2;
  alVar2 = x[0x10];
  alVar1 = x[0x2f];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x10] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x2f] = alVar2;
  alVar2 = x[0x11];
  alVar1 = x[0x2e];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x11] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x2e] = alVar2;
  alVar2 = x[0x12];
  alVar1 = x[0x2d];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x12] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x2d] = alVar2;
  alVar2 = x[0x13];
  alVar1 = x[0x2c];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x13] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x2c] = alVar2;
  alVar2 = x[0x14];
  alVar1 = x[0x2b];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x14] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x2b] = alVar2;
  alVar2 = x[0x15];
  alVar1 = x[0x2a];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x15] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x2a] = alVar2;
  alVar2 = x[0x16];
  alVar1 = x[0x29];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x16] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x29] = alVar2;
  alVar2 = x[0x17];
  alVar1 = x[0x28];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x17] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x28] = alVar2;
  alVar2 = x[0x18];
  alVar1 = x[0x27];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x18] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x27] = alVar2;
  alVar2 = x[0x19];
  alVar1 = x[0x26];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x19] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x26] = alVar2;
  alVar2 = x[0x1a];
  alVar1 = x[0x25];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1a] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x25] = alVar2;
  alVar2 = x[0x1b];
  alVar1 = x[0x24];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1b] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x24] = alVar2;
  alVar2 = x[0x1c];
  alVar1 = x[0x23];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1c] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x23] = alVar2;
  alVar2 = x[0x1d];
  alVar1 = x[0x22];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1d] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x22] = alVar2;
  alVar2 = x[0x1e];
  alVar1 = x[0x21];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1e] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x21] = alVar2;
  alVar2 = x[0x1f];
  alVar1 = x[0x20];
  alVar3 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x1f] = alVar3;
  alVar2 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])alVar1);
  output[0x20] = alVar2;
  return;
}

Assistant:

static inline void idct64_stage11_sse2(__m128i *output, __m128i *x) {
  btf_16_adds_subs_out_sse2(output[0], output[63], x[0], x[63]);
  btf_16_adds_subs_out_sse2(output[1], output[62], x[1], x[62]);
  btf_16_adds_subs_out_sse2(output[2], output[61], x[2], x[61]);
  btf_16_adds_subs_out_sse2(output[3], output[60], x[3], x[60]);
  btf_16_adds_subs_out_sse2(output[4], output[59], x[4], x[59]);
  btf_16_adds_subs_out_sse2(output[5], output[58], x[5], x[58]);
  btf_16_adds_subs_out_sse2(output[6], output[57], x[6], x[57]);
  btf_16_adds_subs_out_sse2(output[7], output[56], x[7], x[56]);
  btf_16_adds_subs_out_sse2(output[8], output[55], x[8], x[55]);
  btf_16_adds_subs_out_sse2(output[9], output[54], x[9], x[54]);
  btf_16_adds_subs_out_sse2(output[10], output[53], x[10], x[53]);
  btf_16_adds_subs_out_sse2(output[11], output[52], x[11], x[52]);
  btf_16_adds_subs_out_sse2(output[12], output[51], x[12], x[51]);
  btf_16_adds_subs_out_sse2(output[13], output[50], x[13], x[50]);
  btf_16_adds_subs_out_sse2(output[14], output[49], x[14], x[49]);
  btf_16_adds_subs_out_sse2(output[15], output[48], x[15], x[48]);
  btf_16_adds_subs_out_sse2(output[16], output[47], x[16], x[47]);
  btf_16_adds_subs_out_sse2(output[17], output[46], x[17], x[46]);
  btf_16_adds_subs_out_sse2(output[18], output[45], x[18], x[45]);
  btf_16_adds_subs_out_sse2(output[19], output[44], x[19], x[44]);
  btf_16_adds_subs_out_sse2(output[20], output[43], x[20], x[43]);
  btf_16_adds_subs_out_sse2(output[21], output[42], x[21], x[42]);
  btf_16_adds_subs_out_sse2(output[22], output[41], x[22], x[41]);
  btf_16_adds_subs_out_sse2(output[23], output[40], x[23], x[40]);
  btf_16_adds_subs_out_sse2(output[24], output[39], x[24], x[39]);
  btf_16_adds_subs_out_sse2(output[25], output[38], x[25], x[38]);
  btf_16_adds_subs_out_sse2(output[26], output[37], x[26], x[37]);
  btf_16_adds_subs_out_sse2(output[27], output[36], x[27], x[36]);
  btf_16_adds_subs_out_sse2(output[28], output[35], x[28], x[35]);
  btf_16_adds_subs_out_sse2(output[29], output[34], x[29], x[34]);
  btf_16_adds_subs_out_sse2(output[30], output[33], x[30], x[33]);
  btf_16_adds_subs_out_sse2(output[31], output[32], x[31], x[32]);
}